

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5FindFunctionMethod
              (sqlite3_vtab *pVtab,int nUnused,char *zName,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **pxFunc,void **ppArg)

{
  Fts5Auxiliary *pFVar1;
  
  pFVar1 = fts5FindAuxiliary((Fts5FullTable *)pVtab[2].pModule,zName);
  if (pFVar1 != (Fts5Auxiliary *)0x0) {
    *pxFunc = fts5ApiCallback;
    *ppArg = pFVar1;
  }
  return (uint)(pFVar1 != (Fts5Auxiliary *)0x0);
}

Assistant:

static int fts5FindFunctionMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nUnused,                    /* Number of SQL function arguments */
  const char *zName,              /* Name of SQL function */
  void (**pxFunc)(sqlite3_context*,int,sqlite3_value**), /* OUT: Result */
  void **ppArg                    /* OUT: User data for *pxFunc */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Auxiliary *pAux;

  UNUSED_PARAM(nUnused);
  pAux = fts5FindAuxiliary(pTab, zName);
  if( pAux ){
    *pxFunc = fts5ApiCallback;
    *ppArg = (void*)pAux;
    return 1;
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}